

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>::
~DeviceObjectBase(DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  *this)

{
  IMemoryAllocator *pIVar1;
  DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
  *this_local;
  
  (this->super_ObjectBase<Diligent::ITextureVk>).super_RefCountedObject<Diligent::ITextureVk>.
  super_ITextureVk.super_ITexture.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_010d5e60;
  pIVar1 = GetStringAllocator();
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    RenderDeviceBase<Diligent::EngineVkImplTraits>::Release
              ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this->m_pDevice);
  }
  RefCntAutoPtr<Diligent::IObject>::~RefCntAutoPtr(&this->m_pUserData);
  ObjectBase<Diligent::ITextureVk>::~ObjectBase(&this->super_ObjectBase<Diligent::ITextureVk>);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }